

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxShift::Resolve(FxShift *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxConstant *this_00;
  byte bVar3;
  undefined4 uVar4;
  uint val;
  FxExpression *pFVar5;
  undefined4 uVar6;
  ExpVal local_30;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar5 = (this->super_FxBinary).left;
  if (pFVar5 != (FxExpression *)0x0) {
    iVar2 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  pFVar5 = (this->super_FxBinary).right;
  if (pFVar5 != (FxExpression *)0x0) {
    iVar2 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
    (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
    pFVar5 = (this->super_FxBinary).left;
    if (pFVar5 != (FxExpression *)0x0 &&
        (FxExpression *)CONCAT44(extraout_var_00,iVar2) != (FxExpression *)0x0) {
      iVar2 = (*(pFVar5->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
      if (((char)iVar2 == '\0') ||
         (iVar2 = (*(((this->super_FxBinary).right)->ValueType->super_PTypeBase).super_DObject.
                    _vptr_DObject[8])(), (char)iVar2 == '\0')) {
        this_00 = (FxConstant *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                   "Incompatible operands for shift operation");
      }
      else {
        bVar1 = FxBinary::Promote(&this->super_FxBinary,ctx,true);
        if (!bVar1) {
          return (FxExpression *)0x0;
        }
        if (((this->super_FxBinary).super_FxExpression.ValueType == (PType *)TypeUInt32) &&
           ((this->super_FxBinary).Operator == 0x116)) {
          (this->super_FxBinary).Operator = 0x117;
        }
        iVar2 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
        if ((char)iVar2 == '\0') {
          return (FxExpression *)this;
        }
        iVar2 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
        if ((char)iVar2 == '\0') {
          return (FxExpression *)this;
        }
        ExpVal::ExpVal(&local_30,(ExpVal *)((this->super_FxBinary).left + 1));
        if ((local_30.Type)->RegType == '\x01') {
          uVar4 = (undefined4)(double)CONCAT44(local_30.field_1._4_4_,local_30.field_1.Int);
        }
        else {
          uVar4 = 0;
          if ((local_30.Type)->RegType == '\0') {
            uVar4 = local_30.field_1.Int;
          }
        }
        ExpVal::~ExpVal(&local_30);
        pFVar5 = (this->super_FxBinary).right + 1;
        ExpVal::ExpVal(&local_30,(ExpVal *)pFVar5);
        if ((local_30.Type)->RegType == '\x01') {
          uVar6 = (undefined4)(double)CONCAT44(local_30.field_1._4_4_,local_30.field_1.Int);
        }
        else {
          uVar6 = 0;
          if ((local_30.Type)->RegType == '\0') {
            uVar6 = local_30.field_1.Int;
          }
        }
        ExpVal::~ExpVal(&local_30);
        this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar5);
        iVar2 = (this->super_FxBinary).Operator;
        bVar3 = (byte)uVar6;
        if (iVar2 == 0x116) {
          val = (int)uVar4 >> (bVar3 & 0x1f);
        }
        else if (iVar2 == 0x118) {
          val = uVar4 << (bVar3 & 0x1f);
        }
        else {
          val = (uint)uVar4 >> (bVar3 & 0x1f);
          if (iVar2 != 0x117) {
            val = 0;
          }
        }
        FxConstant::FxConstant
                  (this_00,val,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
      }
      (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
      return &this_00->super_FxExpression;
    }
  }
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxShift::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
		if (ValueType == TypeUInt32 && Operator == TK_RShift) Operator = TK_URShift;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for shift operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == TK_LShift ? v1 << v2 :
			Operator == TK_RShift ? v1 >> v2 :
			Operator == TK_URShift ? int((unsigned int)(v1) >> v2) : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}